

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

void __thiscall icu_63::Package::removeItem(Package *this,int32_t idx)

{
  int iVar1;
  int iVar2;
  
  if (-1 < idx) {
    if (this->items[(uint)idx].isDataOwned != '\0') {
      uprv_free_63(this->items[(uint)idx].data);
    }
    iVar1 = this->itemCount;
    iVar2 = iVar1 - (idx + 1);
    if (iVar2 != 0 && idx + 1 <= iVar1) {
      memmove(this->items + (uint)idx,this->items + (ulong)(uint)idx + 1,(long)iVar2 * 0x18);
      iVar1 = this->itemCount;
    }
    this->itemCount = iVar1 + -1;
    if (idx <= this->findNextIndex) {
      this->findNextIndex = this->findNextIndex + -1;
    }
  }
  return;
}

Assistant:

void
Package::removeItem(int32_t idx) {
    if(idx>=0) {
        // remove the item
        if(items[idx].isDataOwned) {
            uprv_free(items[idx].data);
        }

        // move the following items up
        if((idx+1)<itemCount) {
            memmove(items+idx, items+idx+1, (itemCount-(idx+1))*sizeof(Item));
        }
        --itemCount;

        if(idx<=findNextIndex) {
            --findNextIndex;
        }
    }
}